

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O1

char * re2::utfrune(char *s,Rune c)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  Rune r;
  int local_1c;
  
  if (c < 0x80) {
    pcVar3 = strchr(s,c);
    return pcVar3;
  }
  do {
    cVar1 = *s;
    if (cVar1 < '\0') {
      uVar2 = chartorune(&local_1c,s);
      if (local_1c == c) {
        return s;
      }
      uVar4 = (ulong)uVar2;
    }
    else {
      if (cVar1 == '\0') {
        return (char *)0x0;
      }
      uVar4 = 1;
      if (cVar1 == c) {
        return s;
      }
    }
    s = s + uVar4;
  } while( true );
}

Assistant:

char*
utfrune(const char *s, Rune c)
{
	long c1;
	Rune r;
	int n;

	if(c < Runesync)		/* not part of utf sequence */
		return strchr((char*)s, c);

	for(;;) {
		c1 = *(unsigned char*)s;
		if(c1 < Runeself) {	/* one byte rune */
			if(c1 == 0)
				return 0;
			if(c1 == c)
				return (char*)s;
			s++;
			continue;
		}
		n = chartorune(&r, s);
		if(r == c)
			return (char*)s;
		s += n;
	}
	return 0;
}